

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O0

xmlChar * xmlCatalogXMLResolveURI(xmlCatalogEntryPtr catal,xmlChar *URI)

{
  int iVar1;
  xmlChar *pxVar2;
  int local_1e0;
  int local_1dc;
  int i;
  int nbList;
  xmlChar *delegates [50];
  int len;
  int lenrewrite;
  xmlCatalogEntryPtr rewrite;
  int haveNext;
  int haveDelegate;
  xmlCatalogEntryPtr cur;
  xmlChar *ret;
  xmlChar *URI_local;
  xmlCatalogEntryPtr catal_local;
  
  rewrite._0_4_ = 0;
  _len = (xmlCatalogEntryPtr)0x0;
  delegates[0x31]._4_4_ = 0;
  if (catal == (xmlCatalogEntryPtr)0x0) {
    catal_local = (xmlCatalogEntryPtr)0x0;
  }
  else if (URI == (xmlChar *)0x0) {
    catal_local = (xmlCatalogEntryPtr)0x0;
  }
  else if (catal->depth < 0x33) {
    rewrite._4_4_ = 0;
    for (_haveNext = catal; _haveNext != (xmlCatalogEntryPtr)0x0; _haveNext = _haveNext->next) {
      switch(_haveNext->type) {
      case XML_CATA_NEXT_CATALOG:
        rewrite._0_4_ = (int)rewrite + 1;
        break;
      default:
        break;
      case XML_CATA_URI:
        iVar1 = xmlStrEqual(URI,_haveNext->name);
        if (iVar1 != 0) {
          if (xmlDebugCatalogs != 0) {
            xmlCatalogPrintDebug("Found URI match %s\n",_haveNext->name);
          }
          pxVar2 = xmlStrdup(_haveNext->URL);
          return pxVar2;
        }
        break;
      case XML_CATA_REWRITE_URI:
        delegates[0x31]._0_4_ = xmlStrlen(_haveNext->name);
        if ((delegates[0x31]._4_4_ < (int)delegates[0x31]) &&
           (iVar1 = xmlStrncmp(URI,_haveNext->name,(int)delegates[0x31]), iVar1 == 0)) {
          delegates[0x31]._4_4_ = (int)delegates[0x31];
          _len = _haveNext;
        }
        break;
      case XML_CATA_DELEGATE_URI:
        pxVar2 = _haveNext->name;
        iVar1 = xmlStrlen(_haveNext->name);
        iVar1 = xmlStrncmp(URI,pxVar2,iVar1);
        if (iVar1 == 0) {
          rewrite._4_4_ = rewrite._4_4_ + 1;
        }
      }
    }
    if (_len == (xmlCatalogEntryPtr)0x0) {
      if (rewrite._4_4_ != 0) {
        local_1dc = 0;
        _haveNext = catal;
        do {
          while( true ) {
            if (_haveNext == (xmlCatalogEntryPtr)0x0) {
              return (xmlChar *)0xffffffffffffffff;
            }
            if ((_haveNext->type == XML_CATA_DELEGATE_SYSTEM) ||
               (_haveNext->type == XML_CATA_DELEGATE_URI)) break;
LAB_0018e105:
            _haveNext = _haveNext->next;
          }
          pxVar2 = _haveNext->name;
          iVar1 = xmlStrlen(_haveNext->name);
          iVar1 = xmlStrncmp(URI,pxVar2,iVar1);
          if (iVar1 != 0) goto LAB_0018e105;
          local_1e0 = 0;
          while ((local_1e0 < local_1dc &&
                 (iVar1 = xmlStrEqual(_haveNext->URL,*(xmlChar **)(&i + (long)local_1e0 * 2)),
                 iVar1 == 0))) {
            local_1e0 = local_1e0 + 1;
          }
          if (local_1dc <= local_1e0) {
            if (local_1dc < 0x32) {
              *(xmlChar **)(&i + (long)local_1dc * 2) = _haveNext->URL;
              local_1dc = local_1dc + 1;
            }
            if (_haveNext->children == (_xmlCatalogEntry *)0x0) {
              xmlFetchXMLCatalogFile(_haveNext);
            }
            if (_haveNext->children != (_xmlCatalogEntry *)0x0) {
              if (xmlDebugCatalogs != 0) {
                xmlCatalogPrintDebug("Trying URI delegate %s\n",_haveNext->URL);
              }
              pxVar2 = xmlCatalogListXMLResolveURI(_haveNext->children,URI);
              if (pxVar2 != (xmlChar *)0x0) {
                return pxVar2;
              }
            }
            goto LAB_0018e105;
          }
          _haveNext = _haveNext->next;
        } while( true );
      }
      _haveNext = catal;
      if ((int)rewrite != 0) {
        for (; _haveNext != (xmlCatalogEntryPtr)0x0; _haveNext = _haveNext->next) {
          if (_haveNext->type == XML_CATA_NEXT_CATALOG) {
            if (_haveNext->children == (_xmlCatalogEntry *)0x0) {
              xmlFetchXMLCatalogFile(_haveNext);
            }
            if ((_haveNext->children != (_xmlCatalogEntry *)0x0) &&
               (pxVar2 = xmlCatalogListXMLResolveURI(_haveNext->children,URI),
               pxVar2 != (xmlChar *)0x0)) {
              return pxVar2;
            }
          }
        }
      }
      catal_local = (xmlCatalogEntryPtr)0x0;
    }
    else {
      if (xmlDebugCatalogs != 0) {
        xmlCatalogPrintDebug("Using rewriting rule %s\n",_len->name);
      }
      cur = (xmlCatalogEntryPtr)xmlStrdup(_len->URL);
      if (cur != (xmlCatalogEntryPtr)0x0) {
        cur = (xmlCatalogEntryPtr)xmlStrcat((xmlChar *)cur,URI + delegates[0x31]._4_4_);
      }
      catal_local = cur;
    }
  }
  else {
    xmlCatalogErr(catal,(xmlNodePtr)0x0,0x676,"Detected recursion in catalog %s\n",catal->name,
                  (xmlChar *)0x0,(xmlChar *)0x0);
    catal_local = (xmlCatalogEntryPtr)0x0;
  }
  return (xmlChar *)catal_local;
}

Assistant:

static xmlChar *
xmlCatalogXMLResolveURI(xmlCatalogEntryPtr catal, const xmlChar *URI) {
    xmlChar *ret = NULL;
    xmlCatalogEntryPtr cur;
    int haveDelegate = 0;
    int haveNext = 0;
    xmlCatalogEntryPtr rewrite = NULL;
    int lenrewrite = 0, len;

    if (catal == NULL)
	return(NULL);

    if (URI == NULL)
	return(NULL);

    if (catal->depth > MAX_CATAL_DEPTH) {
	xmlCatalogErr(catal, NULL, XML_CATALOG_RECURSION,
		      "Detected recursion in catalog %s\n",
		      catal->name, NULL, NULL);
	return(NULL);
    }

    /*
     * First tries steps 2/ 3/ 4/ if a system ID is provided.
     */
    cur = catal;
    haveDelegate = 0;
    while (cur != NULL) {
	switch (cur->type) {
	    case XML_CATA_URI:
		if (xmlStrEqual(URI, cur->name)) {
		    if (xmlDebugCatalogs)
			xmlCatalogPrintDebug(
				"Found URI match %s\n", cur->name);
		    return(xmlStrdup(cur->URL));
		}
		break;
	    case XML_CATA_REWRITE_URI:
		len = xmlStrlen(cur->name);
		if ((len > lenrewrite) &&
		    (!xmlStrncmp(URI, cur->name, len))) {
		    lenrewrite = len;
		    rewrite = cur;
		}
		break;
	    case XML_CATA_DELEGATE_URI:
		if (!xmlStrncmp(URI, cur->name, xmlStrlen(cur->name)))
		    haveDelegate++;
		break;
	    case XML_CATA_NEXT_CATALOG:
		haveNext++;
		break;
	    default:
		break;
	}
	cur = cur->next;
    }
    if (rewrite != NULL) {
	if (xmlDebugCatalogs)
	    xmlCatalogPrintDebug(
		    "Using rewriting rule %s\n", rewrite->name);
	ret = xmlStrdup(rewrite->URL);
	if (ret != NULL)
	    ret = xmlStrcat(ret, &URI[lenrewrite]);
	return(ret);
    }
    if (haveDelegate) {
	const xmlChar *delegates[MAX_DELEGATE];
	int nbList = 0, i;

	/*
	 * Assume the entries have been sorted by decreasing substring
	 * matches when the list was produced.
	 */
	cur = catal;
	while (cur != NULL) {
	    if (((cur->type == XML_CATA_DELEGATE_SYSTEM) ||
	         (cur->type == XML_CATA_DELEGATE_URI)) &&
		(!xmlStrncmp(URI, cur->name, xmlStrlen(cur->name)))) {
		for (i = 0;i < nbList;i++)
		    if (xmlStrEqual(cur->URL, delegates[i]))
			break;
		if (i < nbList) {
		    cur = cur->next;
		    continue;
		}
		if (nbList < MAX_DELEGATE)
		    delegates[nbList++] = cur->URL;

		if (cur->children == NULL) {
		    xmlFetchXMLCatalogFile(cur);
		}
		if (cur->children != NULL) {
		    if (xmlDebugCatalogs)
			xmlCatalogPrintDebug(
				"Trying URI delegate %s\n", cur->URL);
		    ret = xmlCatalogListXMLResolveURI(
			    cur->children, URI);
		    if (ret != NULL)
			return(ret);
		}
	    }
	    cur = cur->next;
	}
	/*
	 * Apply the cut algorithm explained in 4/
	 */
	return(XML_CATAL_BREAK);
    }
    if (haveNext) {
	cur = catal;
	while (cur != NULL) {
	    if (cur->type == XML_CATA_NEXT_CATALOG) {
		if (cur->children == NULL) {
		    xmlFetchXMLCatalogFile(cur);
		}
		if (cur->children != NULL) {
		    ret = xmlCatalogListXMLResolveURI(cur->children, URI);
		    if (ret != NULL)
			return(ret);
		}
	    }
	    cur = cur->next;
	}
    }

    return(NULL);
}